

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptNumber.cpp
# Opt level: O0

JavascriptString * Js::JavascriptNumber::ToLocaleString(double value,ScriptContext *scriptContext)

{
  code *pcVar1;
  bool bVar2;
  int iVar3;
  charcount_t cVar4;
  Var aValue;
  undefined4 extraout_var;
  Memory *this;
  undefined4 *puVar5;
  TrackAllocData local_a88;
  ulong local_a60;
  size_t szLength;
  char16 *szValue;
  JavascriptString *dblStr;
  JavascriptString *result;
  size_t count;
  WCHAR *pszToBeFreed;
  WCHAR *pszRes;
  WCHAR szRes [1280];
  ScriptContext *scriptContext_local;
  double value_local;
  
  pszToBeFreed = (WCHAR *)0x0;
  count = 0;
  bVar2 = NumberUtilities::IsFinite(value);
  if (bVar2) {
    dblStr = (JavascriptString *)0x0;
    aValue = FormatDoubleToString(value,FormatFixed,-1,scriptContext);
    szValue = (char16 *)VarTo<Js::JavascriptString>(aValue);
    iVar3 = (*(((JavascriptString *)szValue)->super_RecyclableObject).super_FinalizableObject.
              super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x65])();
    szLength = CONCAT44(extraout_var,iVar3);
    cVar4 = JavascriptString::GetLength((JavascriptString *)szValue);
    local_a60 = (ulong)cVar4;
    pszToBeFreed = (WCHAR *)&pszRes;
    result = (JavascriptString *)
             PlatformAgnostic::Numbers::Utility::NumberToDefaultLocaleString
                       ((WCHAR *)szLength,local_a60,pszToBeFreed,0x500);
    if (result == (JavascriptString *)0x0) {
      value_local = (double)szValue;
    }
    else {
      if ((JavascriptString *)0x500 < result) {
        Memory::TrackAllocData::CreateTrackAllocData
                  (&local_a88,(type_info *)&char16_t::typeinfo,0,(size_t)result,
                   "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptNumber.cpp"
                   ,0x458);
        this = (Memory *)
               Memory::HeapAllocator::TrackAllocInfo(&Memory::HeapAllocator::Instance,&local_a88);
        count = (size_t)Memory::AllocateArray<Memory::HeapAllocator,char16_t,false>
                                  (this,(HeapAllocator *)Memory::HeapAllocator::Alloc,0,
                                   (size_t)result);
        pszToBeFreed = (WCHAR *)count;
        result = (JavascriptString *)
                 PlatformAgnostic::Numbers::Utility::NumberToDefaultLocaleString
                           ((WCHAR *)szLength,local_a60,(WCHAR *)count,(size_t)result);
        if (result == (JavascriptString *)0x0) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar5 = 1;
          bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptNumber.cpp"
                                      ,0x45e,"(false)","GetNumberFormatEx failed");
          if (bVar2) {
            puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar5 = 0;
            JavascriptError::ThrowError(scriptContext,-0x7ff5ffcd,(PCWSTR)0x0);
          }
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
      }
      if (result != (JavascriptString *)0x0) {
        dblStr = JavascriptString::NewCopySz(pszToBeFreed,scriptContext);
      }
      if (count != 0) {
        Memory::DeleteArray<Memory::HeapAllocator,char16_t>
                  (&Memory::HeapAllocator::Instance,(size_t)result,(char16_t *)count);
      }
      value_local = (double)dblStr;
    }
  }
  else {
    value_local = (double)ToLocaleStringNanOrInfinite(value,scriptContext);
  }
  return (JavascriptString *)value_local;
}

Assistant:

JavascriptString* JavascriptNumber::ToLocaleString(double value, ScriptContext* scriptContext)
    {
        WCHAR   szRes[bufSize];
        WCHAR * pszRes = NULL;
        WCHAR * pszToBeFreed = NULL;
        size_t  count;

        if (!Js::NumberUtilities::IsFinite(value))
        {
            //
            // +- Infinity : use the localized string
            // NaN would be returned as NaN
            //
            return ToLocaleStringNanOrInfinite(value, scriptContext);
        }

        JavascriptString *result = nullptr;

        JavascriptString *dblStr = VarTo<JavascriptString>(FormatDoubleToString(value, NumberUtilities::FormatFixed, -1, scriptContext));
        const char16* szValue = dblStr->GetSz();
        const size_t szLength = dblStr->GetLength();

        pszRes = szRes;
        count = Numbers::Utility::NumberToDefaultLocaleString(szValue, szLength, pszRes, bufSize);

        if( count == 0 )
        {
            return dblStr;
        }
        else
        {
            if( count > bufSize )
            {
                pszRes = pszToBeFreed = HeapNewArray(char16, count);

                count = Numbers::Utility::NumberToDefaultLocaleString(szValue, szLength, pszRes, count);

                if ( count == 0 )
                {
                     AssertMsg(false, "GetNumberFormatEx failed");
                     JavascriptError::ThrowError(scriptContext, VBSERR_InternalError);
                }
            }

            if ( count != 0 )
            {
                result = JavascriptString::NewCopySz(pszRes, scriptContext);
            }
        }

        if ( pszToBeFreed )
        {
            HeapDeleteArray(count, pszToBeFreed);
        }

        return result;
    }